

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

int __thiscall
cmCPackIFWPackage::ConfigureFromComponent(cmCPackIFWPackage *this,cmCPackComponent *component)

{
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *pcVar2;
  bool bVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  reference __k;
  mapped_type *__x;
  size_type sVar6;
  ostream *poVar7;
  string *psVar8;
  pair<std::_Rb_tree_const_iterator<cmCPackIFWPackage_*>,_bool> pVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  string local_580 [32];
  undefined1 local_560 [8];
  ostringstream cmCPackLog_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  char *local_3c8;
  char *option_3;
  undefined1 local_3a0 [8];
  ostringstream cmCPackLog_msg;
  allocator local_221;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  char *local_1e0;
  char *option_2;
  undefined1 local_1d0;
  __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
  local_1c8;
  cmCPackComponent **local_1c0;
  __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
  local_1b8;
  iterator dit;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  char *local_168;
  char *option_1;
  char *local_140;
  char *option;
  string local_130;
  char *local_110;
  char *optPACKAGE_VERSION;
  char *local_e8;
  char *optVERSION;
  key_type local_d8;
  allocator local_b1;
  key_type local_b0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string prefix;
  cmCPackComponent *component_local;
  cmCPackIFWPackage *this_local;
  
  if (component == (cmCPackComponent *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    prefix.field_2._8_8_ = component;
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_80,(string *)prefix.field_2._8_8_);
    std::operator+(&local_60,"CPACK_IFW_COMPONENT_",&local_80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,"_");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    psVar8 = (string *)(prefix.field_2._8_8_ + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->DisplayName,&local_b0);
    std::__cxx11::string::operator=((string *)pmVar4,psVar8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    psVar8 = (string *)(prefix.field_2._8_8_ + 0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"",(allocator *)((long)&optVERSION + 7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->Description,&local_d8);
    std::__cxx11::string::operator=((string *)pmVar4,psVar8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&optVERSION + 7));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &optPACKAGE_VERSION,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "VERSION");
    pcVar5 = cmCPackIFWCommon::GetOption
                       (&this->super_cmCPackIFWCommon,(string *)&optPACKAGE_VERSION);
    std::__cxx11::string::~string((string *)&optPACKAGE_VERSION);
    local_e8 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_130,"CPACK_PACKAGE_VERSION",(allocator *)((long)&option + 7));
      pcVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option + 7));
      local_110 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)&this->Version,"1.0.0");
      }
      else {
        std::__cxx11::string::operator=((string *)&this->Version,pcVar5);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Version,pcVar5);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "SCRIPT");
    pcVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&option_1);
    std::__cxx11::string::~string((string *)&option_1);
    local_140 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Script,pcVar5);
    }
    std::operator+(&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "USER_INTERFACES");
    pcVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    local_168 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->UserInterfaces);
      pcVar5 = local_168;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1a8,pcVar5,(allocator *)((long)&dit._M_current + 7));
      cmSystemTools::ExpandListArgument(&local_1a8,&this->UserInterfaces,false);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&dit._M_current + 7));
    }
    bVar3 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::empty
                      ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                       (prefix.field_2._8_8_ + 200));
    if (!bVar3) {
      __gnu_cxx::
      __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
      ::__normal_iterator(&local_1b8);
      local_1c0 = (cmCPackComponent **)
                  std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::begin
                            ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                             (prefix.field_2._8_8_ + 200));
      local_1b8._M_current = local_1c0;
      while( true ) {
        local_1c8._M_current =
             (cmCPackComponent **)
             std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::end
                       ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                        (prefix.field_2._8_8_ + 200));
        bVar3 = __gnu_cxx::operator!=(&local_1b8,&local_1c8);
        if (!bVar3) break;
        pcVar1 = (this->super_cmCPackIFWCommon).Generator;
        __k = __gnu_cxx::
              __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
              ::operator*(&local_1b8);
        __x = std::
              map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
              ::operator[](&pcVar1->ComponentPackages,__k);
        pVar9 = std::
                set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
                ::insert(&this->Dependencies,__x);
        option_2 = (char *)pVar9.first._M_node;
        local_1d0 = pVar9.second;
        __gnu_cxx::
        __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
        ::operator++(&local_1b8);
      }
    }
    std::operator+(&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "LICENSES");
    pcVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    local_1e0 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Licenses);
      pcVar5 = local_1e0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_220,pcVar5,&local_221);
      cmSystemTools::ExpandListArgument(&local_220,&this->Licenses,false);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->Licenses);
      if ((sVar6 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
        poVar7 = std::operator<<((ostream *)local_3a0,(string *)local_40);
        poVar7 = std::operator<<(poVar7,"LICENSES");
        poVar7 = std::operator<<(poVar7," should contain pairs of <display_name> and <file_path>.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
          pcVar2 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar2,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0xde,pcVar5);
          std::__cxx11::string::~string((string *)&option_3);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->Licenses);
      }
    }
    std::operator+(&local_3e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "PRIORITY");
    pcVar5 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    local_3c8 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->SortingPriority,pcVar5);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_560);
      poVar7 = std::operator<<((ostream *)local_560,"The \"PRIORITY\" option is set ");
      poVar7 = std::operator<<(poVar7,"for component \"");
      poVar7 = std::operator<<(poVar7,(string *)prefix.field_2._8_8_);
      poVar7 = std::operator<<(poVar7,"\", but there option is ");
      poVar7 = std::operator<<(poVar7,"deprecated. Please use \"SORTING_PRIORITY\" option instead.")
      ;
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
        pcVar2 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar2,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                        ,0xea,pcVar5);
        std::__cxx11::string::~string(local_580);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_560);
    }
    pcVar5 = "true";
    if ((*(uint *)(prefix.field_2._8_8_ + 0x48) >> 2 & 1) != 0) {
      pcVar5 = "false";
    }
    std::__cxx11::string::operator=((string *)&this->Default,pcVar5);
    std::operator+(&local_5a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "ESSENTIAL");
    bVar3 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
    if (bVar3) {
      std::__cxx11::string::operator=((string *)&this->Essential,"true");
    }
    pcVar5 = "PK\x01\x02";
    if ((*(uint *)(prefix.field_2._8_8_ + 0x48) >> 1 & 1) != 0) {
      pcVar5 = " || true";
    }
    std::__cxx11::string::operator=((string *)&this->Virtual,pcVar5 + 4);
    pcVar5 = "false";
    if ((*(byte *)(prefix.field_2._8_8_ + 0x48) & 1) != 0) {
      pcVar5 = "true";
    }
    std::__cxx11::string::operator=((string *)&this->ForcedInstallation,pcVar5);
    this_local._4_4_ = ConfigureFromPrefix(this,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromComponent(cmCPackComponent* component)
{
  if (!component) {
    return 0;
  }

  // Restore defaul configuration
  this->DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_" +
    cmsys::SystemTools::UpperCase(component->Name) + "_";

  // Display name
  this->DisplayName[""] = component->DisplayName;

  // Description
  this->Description[""] = component->Description;

  // Version
  if (const char* optVERSION = this->GetOption(prefix + "VERSION")) {
    this->Version = optVERSION;
  } else if (const char* optPACKAGE_VERSION =
               this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = optPACKAGE_VERSION;
  } else {
    this->Version = "1.0.0";
  }

  // Script
  if (const char* option = this->GetOption(prefix + "SCRIPT")) {
    this->Script = option;
  }

  // User interfaces
  if (const char* option = this->GetOption(prefix + "USER_INTERFACES")) {
    this->UserInterfaces.clear();
    cmSystemTools::ExpandListArgument(option, this->UserInterfaces);
  }

  // CMake dependencies
  if (!component->Dependencies.empty()) {
    std::vector<cmCPackComponent*>::iterator dit;
    for (dit = component->Dependencies.begin();
         dit != component->Dependencies.end(); ++dit) {
      this->Dependencies.insert(this->Generator->ComponentPackages[*dit]);
    }
  }

  // Licenses
  if (const char* option = this->GetOption(prefix + "LICENSES")) {
    this->Licenses.clear();
    cmSystemTools::ExpandListArgument(option, this->Licenses);
    if (this->Licenses.size() % 2 != 0) {
      cmCPackIFWLogger(
        WARNING,
        prefix << "LICENSES"
               << " should contain pairs of <display_name> and <file_path>."
               << std::endl);
      this->Licenses.clear();
    }
  }

  // Priority
  if (const char* option = this->GetOption(prefix + "PRIORITY")) {
    this->SortingPriority = option;
    cmCPackIFWLogger(
      WARNING, "The \"PRIORITY\" option is set "
        << "for component \"" << component->Name << "\", but there option is "
        << "deprecated. Please use \"SORTING_PRIORITY\" option instead."
        << std::endl);
  }

  // Default
  this->Default = component->IsDisabledByDefault ? "false" : "true";

  // Essential
  if (this->IsOn(prefix + "ESSENTIAL")) {
    this->Essential = "true";
  }

  // Virtual
  this->Virtual = component->IsHidden ? "true" : "";

  // ForcedInstallation
  this->ForcedInstallation = component->IsRequired ? "true" : "false";

  return this->ConfigureFromPrefix(prefix);
}